

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

void __thiscall
TPZHybridizeHDiv::GetAllConnectedCompElSides
          (TPZHybridizeHDiv *this,TPZInterpolatedElement *intel,int side,
          TPZStack<TPZCompElSide,_10> *celsidestack)

{
  TPZDepend *pTVar1;
  TPZCompElSide *pTVar2;
  long lVar3;
  TPZCompElSide *pTVar4;
  int iVar5;
  int iVar6;
  TPZConnect *pTVar7;
  TPZGeoEl *pTVar8;
  long lVar9;
  TPZGeoEl *pTVar10;
  TPZCompEl *pTVar11;
  long lVar12;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide local_108;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  pTVar7 = TPZInterpolatedElement::SideConnect(intel,0,side);
  pTVar1 = pTVar7->fDependList;
  pTVar8 = TPZCompEl::Reference((TPZCompEl *)intel);
  local_108.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_108.fGeoEl = pTVar8;
  local_108.fSide = side;
  if (pTVar1 != (TPZDepend *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x418);
  }
  lVar9 = 0x28;
  do {
    *(undefined8 *)((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar9 + -0x28)
         = 0;
    *(undefined4 *)
     ((long)&(((TPZManVector<TPZCompElSide,_10> *)
              (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
             super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar9) = 0xffffffff;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 200);
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
       local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a690;
  TPZGeoElSide::EqualLevelCompElementList(&local_108,&local_f0,1,0);
  pTVar4 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore;
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements != 0) {
    lVar9 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements <<
            4;
    lVar12 = 0;
    do {
      pTVar10 = TPZCompEl::Reference(*(TPZCompEl **)((long)&pTVar4->fEl + lVar12));
      iVar5 = (**(code **)(*(long *)pTVar10 + 0x210))(pTVar10);
      iVar6 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
      if (iVar5 == iVar6) {
        pTVar10 = TPZCompEl::Reference(*(TPZCompEl **)((long)&pTVar4->fEl + lVar12));
        if (this->fIdToHybridize == -1000) {
          pTVar11 = *(TPZCompEl **)((long)&pTVar4->fEl + lVar12);
          iVar5 = *(int *)((long)&pTVar4->fSide + lVar12);
          (*(celsidestack->super_TPZManVector<TPZCompElSide,_10>).super_TPZVec<TPZCompElSide>.
            _vptr_TPZVec[3])(celsidestack,
                             (celsidestack->super_TPZManVector<TPZCompElSide,_10>).
                             super_TPZVec<TPZCompElSide>.fNElements + 1);
        }
        else {
          if (pTVar10->fMatId != this->fIdToHybridize) goto LAB_01441d8b;
          pTVar11 = *(TPZCompEl **)((long)&pTVar4->fEl + lVar12);
          iVar5 = *(int *)((long)&pTVar4->fSide + lVar12);
          (*(celsidestack->super_TPZManVector<TPZCompElSide,_10>).super_TPZVec<TPZCompElSide>.
            _vptr_TPZVec[3])(celsidestack,
                             (celsidestack->super_TPZManVector<TPZCompElSide,_10>).
                             super_TPZVec<TPZCompElSide>.fNElements + 1);
        }
        pTVar2 = (celsidestack->super_TPZManVector<TPZCompElSide,_10>).super_TPZVec<TPZCompElSide>.
                 fStore;
        lVar3 = (celsidestack->super_TPZManVector<TPZCompElSide,_10>).super_TPZVec<TPZCompElSide>.
                fNElements;
        pTVar2[lVar3 + -1].fEl = pTVar11;
        pTVar2[lVar3 + -1].fSide = iVar5;
      }
LAB_01441d8b:
      lVar12 = lVar12 + 0x10;
    } while (lVar9 != lVar12);
  }
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
      local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_018142b0;
    if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
        (TPZCompElSide *)0x0) {
      operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fStore);
    }
  }
  return;
}

Assistant:

void TPZHybridizeHDiv::GetAllConnectedCompElSides(TPZInterpolatedElement *intel, int side, TPZStack<TPZCompElSide> &celsidestack) {
    bool isrestrained = false;
    {
        TPZConnect &c = intel->SideConnect(0, side);
        if (c.HasDependency()) {
            isrestrained = true;
        }
    }
    TPZGeoEl *gel = intel->Reference();
    TPZGeoElSide gelside(gel, side);

    if (isrestrained == true) {
        /// if the side is restrained we will hybridize between the element and the larger element
        DebugStop();
    } else {
        // if the connect is not restrained
        // - the neighbour should be of the same dimension
        //   if the neighbour is of lower dimension it is a boundary element
        TPZStack<TPZCompElSide> celstack;
        gelside.EqualLevelCompElementList(celstack, 1, 0);
        for (auto& cel : celstack) {
            TPZGeoEl *neigh = cel.Element()->Reference();
            if (neigh->Dimension() == gel->Dimension()) {
                const int celmatid = cel.Element()->Reference()->MaterialId();
                if (fIdToHybridize != -1000) {
                    if (celmatid == fIdToHybridize) {
                        celsidestack.push_back(cel);
                    }
                }
                else {
                    celsidestack.push_back(cel);
                }
                
            }
        } // cel
    } // else
}